

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_bzip2.c
# Opt level: O1

int archive_compressor_bzip2_close(archive_write_filter *f)

{
  private_data_conflict4 *data;
  int iVar1;
  int iVar2;
  
  data = (private_data_conflict4 *)f->data;
  iVar1 = drive_compressor(f,data,1);
  if (iVar1 == 0) {
    iVar1 = __archive_write_filter
                      (f->next_filter,data->compressed,
                       data->compressed_buffer_size - (ulong)(data->stream).avail_out);
  }
  iVar2 = BZ2_bzCompressEnd(&data->stream);
  if (iVar2 != 0) {
    archive_set_error(f->archive,0x16,"Failed to clean up compressor");
    iVar1 = -0x1e;
  }
  return iVar1;
}

Assistant:

static int
archive_compressor_bzip2_close(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;
	int ret;

	/* Finish compression cycle. */
	ret = drive_compressor(f, data, 1);
	if (ret == ARCHIVE_OK) {
		/* Write the last block */
		ret = __archive_write_filter(f->next_filter,
		    data->compressed,
		    data->compressed_buffer_size - data->stream.avail_out);
	}

	switch (BZ2_bzCompressEnd(&(data->stream))) {
	case BZ_OK:
		break;
	default:
		archive_set_error(f->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Failed to clean up compressor");
		ret = ARCHIVE_FATAL;
	}
	return ret;
}